

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SafeInt.hpp
# Opt level: O2

void SubtractionHelper<unsigned_char,_long_long,_16>::
     SubtractThrow<safeint_exception_handlers::SafeInt_InvalidParameter>
               (uchar *lhs,longlong *rhs,longlong *result)

{
  long lVar1;
  
  lVar1 = *rhs;
  if (lVar1 < 0) {
    lVar1 = (ulong)*lhs - lVar1;
    if (lVar1 < 0) {
      safeint_exception_handlers::SafeInt_InvalidParameter::SafeIntOnOverflow();
    }
  }
  else {
    lVar1 = (ulong)*lhs - lVar1;
  }
  *result = lVar1;
  return;
}

Assistant:

SAFEINT_CONSTEXPR14 static void SubtractThrow( const U& lhs, const T& rhs, T& result ) SAFEINT_CPP_THROW
    {
        // U unsigned 32-bit or less, T std::int64_t
        if( rhs >= 0 )
        {
            // overflow not possible
            result = (T)( (std::int64_t)lhs - rhs );
            return;
        }
        else
        {
            // we effectively have an addition
            // which cannot overflow internally
            std::uint64_t tmp = (std::uint64_t)lhs + (std::uint64_t)( -rhs );

            if( tmp <= (std::uint64_t)std::numeric_limits<T>::max() )
            {
                result = (T)tmp;
                return;
            }
        }

        E::SafeIntOnOverflow();
    }